

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void lyd_insert_setinvalid(lyd_node *node)

{
  int iVar1;
  bool bVar2;
  lyd_node *local_28;
  lyd_node *parent_list;
  lyd_node *elem;
  lyd_node *next;
  lyd_node *node_local;
  
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0xcc0,"void lyd_insert_setinvalid(struct lyd_node *)");
  }
  iVar1 = ly_new_node_validity(node->schema);
  node->validity = (uint8_t)iVar1;
  local_28 = node->parent;
  while( true ) {
    bVar2 = false;
    if (local_28 != (lyd_node *)0x0) {
      bVar2 = local_28->schema->nodetype != LYS_LIST;
    }
    if (!bVar2) break;
    local_28 = local_28->parent;
  }
  if ((local_28 != (lyd_node *)0x0) && (parent_list = node, (local_28->validity & 1) == 0)) {
    while (parent_list != (lyd_node *)0x0) {
      if (parent_list->schema->nodetype == LYS_LIST) {
LAB_0018d4bb:
        elem = parent_list->next;
        if ((elem == (lyd_node *)0x0) && (parent_list == node)) break;
      }
      else {
        if ((parent_list->schema->nodetype == LYS_LEAF) &&
           ((parent_list->schema->flags & 0x100) != 0)) {
          local_28->validity = local_28->validity | 1;
          break;
        }
        if ((parent_list->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
          if (parent_list != node) goto LAB_0018d4bb;
          break;
        }
        elem = parent_list->child;
        if (elem == (lyd_node *)0x0) goto LAB_0018d4bb;
      }
      while ((elem == (lyd_node *)0x0 &&
             (parent_list = parent_list->parent, parent_list->parent != node->parent))) {
        elem = parent_list->parent->next;
      }
      parent_list = elem;
    }
  }
  if (node->parent != (lyd_node *)0x0) {
    if ((node->schema->nodetype & LYS_LEAFLIST) == LYS_UNKNOWN) {
      if (((node->schema->nodetype & LYS_LIST) != LYS_UNKNOWN) &&
         (*(int *)((long)&node->schema[1].iffeature + 4) != 0)) {
        node->parent->validity = node->parent->validity | 2;
      }
    }
    else if (*(int *)((long)&node->schema[1].priv + 4) != 0) {
      node->parent->validity = node->parent->validity | 2;
    }
  }
  return;
}

Assistant:

static void
lyd_insert_setinvalid(struct lyd_node *node)
{
    struct lyd_node *next, *elem, *parent_list;

    assert(node);

    /* overall validity of the node itself */
    node->validity = ly_new_node_validity(node->schema);

    /* explore changed unique leaves */
    /* first, get know if there is a list in parents chain */
    for (parent_list = node->parent;
         parent_list && parent_list->schema->nodetype != LYS_LIST;
         parent_list = parent_list->parent);
    if (parent_list && !(parent_list->validity & LYD_VAL_UNIQUE)) {
        /* there is a list, so check if we inserted a leaf supposed to be unique */
        for (elem = node; elem; elem = next) {
            if (elem->schema->nodetype == LYS_LIST) {
                /* stop searching to the depth, children would be unique to a list in subtree */
                goto nextsibling;
            }

            if (elem->schema->nodetype == LYS_LEAF && (elem->schema->flags & LYS_UNIQUE)) {
                /* set flag to list for future validation */
                parent_list->validity |= LYD_VAL_UNIQUE;
                break;
            }

            if (elem->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                if (elem == node) {
                    /* stop the loop */
                    break;
                }
                goto nextsibling;
            }

            /* select next elem to process */
            /* go into children */
            next = elem->child;
            /* go through siblings */
            if (!next) {
nextsibling:
                next = elem->next;
                if (!next) {
                    /* no sibling */
                    if (elem == node) {
                        /* we are done, back in start node */
                        break;
                    }
                }
            }
            /* go back to parents */
            while (!next) {
                elem = elem->parent;
                if (elem->parent == node->parent) {
                    /* we are done, back in start node */
                    break;
                }
                /* parent was actually already processed, so go to the parent's sibling */
                next = elem->parent->next;
            }
        }
    }

    if (node->parent) {
        /* if the inserted node is list/leaflist with constraint on max instances,
         * invalidate the parent to make it validate this */
        if (node->schema->nodetype & LYS_LEAFLIST) {
            if (((struct lys_node_leaflist *)node->schema)->max) {
                node->parent->validity |= LYD_VAL_MAND;
            }
        } else if (node->schema->nodetype & LYS_LIST) {
            if (((struct lys_node_list *)node->schema)->max) {
                node->parent->validity |= LYD_VAL_MAND;
            }
        }
    }
}